

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

int __thiscall yyFlexLexer::LexerInput(yyFlexLexer *this,char *buf,int param_2)

{
  ulong uVar1;
  int param_2_local;
  char *buf_local;
  yyFlexLexer *this_local;
  
  uVar1 = std::ios::eof();
  if (((uVar1 & 1) != 0) || (uVar1 = std::ios::fail(), (uVar1 & 1) != 0)) {
    return 0;
  }
  std::istream::get((char *)&this->yyin);
  uVar1 = std::ios::eof();
  if ((uVar1 & 1) != 0) {
    return 0;
  }
  uVar1 = std::ios::bad();
  if ((uVar1 & 1) == 0) {
    return 1;
  }
  return -1;
}

Assistant:

int yyFlexLexer::LexerInput( char* buf, int max_size )
#endif
{
	if ( yyin.eof() || yyin.fail() )
		return 0;

#ifdef YY_INTERACTIVE
	yyin.get( buf[0] );

	if ( yyin.eof() )
		return 0;

	if ( yyin.bad() )
		return -1;

	return 1;

#else
	(void) yyin.read( buf, max_size );

	if ( yyin.bad() )
		return -1;
	else
		return yyin.gcount();
#endif
}